

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O2

string * google::protobuf::internal::StringTypeHandler::New(Arena *arena,string *value)

{
  string *this;
  
  if (arena == (Arena *)0x0) {
    this = (string *)operator_new(0x20);
  }
  else {
    ArenaImpl::RecordAlloc((ArenaImpl *)arena,(type_info *)&std::__cxx11::string::typeinfo,0x20);
    this = (string *)
           ArenaImpl::AllocateAlignedAndAddCleanup
                     ((ArenaImpl *)arena,0x20,arena_destruct_object<std::__cxx11::string>);
  }
  std::__cxx11::string::string((string *)this,(string *)value);
  return this;
}

Assistant:

static inline std::string* New(Arena* arena, std::string&& value) {
    return Arena::Create<std::string>(arena, std::move(value));
  }